

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_CommandLogging.cpp
# Opt level: O0

void __thiscall
RenX_CommandLoggingPlugin::WriteToLog
          (RenX_CommandLoggingPlugin *this,Server *server,PlayerInfo *player,string_view message)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  string local_60;
  ushort local_3a;
  string *psStack_38;
  unsigned_short serverPort;
  string *serverHostname;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_CommandLoggingPlugin *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (RenX_CommandLoggingPlugin *)message._M_len;
  serverHostname = (string *)player;
  player_local = (PlayerInfo *)server;
  server_local = (Server *)this;
  PrepFile(this);
  uVar1 = std::fstream::is_open();
  if ((uVar1 & 1) != 0) {
    psStack_38 = (string *)RenX::Server::getSocketHostname_abi_cxx11_();
    local_3a = RenX::Server::getSocketPort();
    pcVar2 = (char *)getTimeFormat("%T");
    poVar3 = std::operator<<((ostream *)&this->field_0xd0,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,psStack_38);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3a);
    poVar3 = std::operator<<(poVar3," ");
    std::__cxx11::to_string(&local_60,*(int *)&serverHostname[0xd].field_2);
    poVar3 = std::operator<<(poVar3,(string *)&local_60);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&serverHostname->_M_string_length);
    poVar3 = std::operator<<(poVar3,": ");
    __str._M_str = (char *)message_local._M_len;
    __str._M_len = (size_t)this_local;
    this_00 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,__str);
    std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void RenX_CommandLoggingPlugin::WriteToLog(RenX::Server& server, const RenX::PlayerInfo& player, std::string_view  message) {
	// Check if new file needs to be opened
	PrepFile();

	if (!fs.is_open()) {
		return;
	}

	const std::string& serverHostname = server.getSocketHostname();
	unsigned short serverPort = server.getSocketPort();

	fs << getTimeFormat("%T")
		<< " "
		<< serverHostname
		<< ":"
		<< serverPort
		<< " "
		<< std::to_string(player.access)
		<< " "
		<< player.name
		<< ": "
		<< message
		<< std::endl;
}